

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

vec6F * __thiscall
crnlib::dxt_hc::palettize_color
          (vec6F *__return_storage_ptr__,dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  vec<3U,_float> *local_5b0;
  float local_5a0;
  float local_594;
  vec<3U,_float> *local_580;
  undefined1 local_558 [8];
  vec3F result [2];
  uint i_1;
  uint size;
  uint weights [64];
  vec3F vectors [64];
  uint local_12c;
  uint local_128;
  uint i;
  uint color [64];
  uint pixels_count_local;
  color_quad_u8 *pixels_local;
  dxt_hc *this_local;
  
  color[0x3f] = pixels_count;
  for (local_12c = 0; local_12c < color[0x3f]; local_12c = local_12c + 1) {
    pbVar3 = color_quad<unsigned_char,_int>::operator[](pixels + local_12c,0);
    bVar1 = *pbVar3;
    pbVar3 = color_quad<unsigned_char,_int>::operator[](pixels + local_12c,1);
    bVar2 = *pbVar3;
    pbVar3 = color_quad<unsigned_char,_int>::operator[](pixels + local_12c,2);
    (&local_128)[local_12c] = (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)*pbVar3;
  }
  std::sort<unsigned_int*>(&local_128,&local_128 + color[0x3f]);
  local_580 = (vec<3U,_float> *)(weights + 0x3e);
  do {
    vec<3U,_float>::vec(local_580);
    local_580 = local_580 + 1;
  } while (local_580 != (vec<3U,_float> *)(vectors[0x3f].m_s + 1));
  result[1].m_s[2] = 0.0;
  for (result[1].m_s[1] = 0.0; (uint)result[1].m_s[1] < color[0x3f];
      result[1].m_s[1] = (float)((int)result[1].m_s[1] + 1)) {
    if ((result[1].m_s[1] == 0.0) ||
       ((&local_128)[(uint)result[1].m_s[1]] != (&local_128)[(int)result[1].m_s[1] - 1])) {
      if (((this->m_params).m_perceptual & 1U) == 0) {
        local_594 = this->m_uint8_to_float[(&local_128)[(uint)result[1].m_s[1]] >> 0x10];
      }
      else {
        local_594 = this->m_uint8_to_float[(&local_128)[(uint)result[1].m_s[1]] >> 0x10] * 0.5;
      }
      pfVar4 = vec<3U,_float>::operator[]
                         ((vec<3U,_float> *)(vectors[(ulong)(uint)result[1].m_s[2] - 1].m_s + 1),0);
      *pfVar4 = local_594;
      fVar5 = this->m_uint8_to_float[(&local_128)[(uint)result[1].m_s[1]] >> 8 & 0xff];
      pfVar4 = vec<3U,_float>::operator[]
                         ((vec<3U,_float> *)(vectors[(ulong)(uint)result[1].m_s[2] - 1].m_s + 1),1);
      *pfVar4 = fVar5;
      if (((this->m_params).m_perceptual & 1U) == 0) {
        local_5a0 = this->m_uint8_to_float[(&local_128)[(uint)result[1].m_s[1]] & 0xff];
      }
      else {
        local_5a0 = this->m_uint8_to_float[(&local_128)[(uint)result[1].m_s[1]] & 0xff] * 0.25;
      }
      pfVar4 = vec<3U,_float>::operator[]
                         ((vec<3U,_float> *)(vectors[(ulong)(uint)result[1].m_s[2] - 1].m_s + 1),2);
      *pfVar4 = local_5a0;
      (&i_1)[(uint)result[1].m_s[2]] = 1;
      result[1].m_s[2] = (float)((int)result[1].m_s[2] + 1);
    }
    else {
      (&i_1)[(int)result[1].m_s[2] - 1U] = (&i_1)[(int)result[1].m_s[2] - 1U] + 1;
    }
  }
  local_5b0 = (vec<3U,_float> *)local_558;
  do {
    vec<3U,_float>::vec(local_5b0);
    local_5b0 = local_5b0 + 1;
  } while (local_5b0 != (vec<3U,_float> *)(result[1].m_s + 1));
  split_vectors<crnlib::vec<3u,float>>
            ((vec<3U,_float> (*) [64])(weights + 0x3e),(uint (*) [64])&i_1,(uint)result[1].m_s[2],
             (vec<3U,_float> (*) [2])local_558);
  fVar5 = vec<3U,_float>::length((vec<3U,_float> *)local_558);
  fVar6 = vec<3U,_float>::length((vec<3U,_float> *)(result[0].m_s + 1));
  if (fVar6 < fVar5) {
    utils::swap<crnlib::vec<3u,float>>
              ((vec<3U,_float> *)local_558,(vec<3U,_float> *)(result[0].m_s + 1));
  }
  vec<6U,_float>::vec(__return_storage_ptr__,(vec<6U,_float> *)local_558);
  return __return_storage_ptr__;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}